

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# consolelog.hpp
# Opt level: O2

void __thiscall
github111116::ConsoleLogger::info<char[10],int>(ConsoleLogger *this,char (*args) [10],int *args_1)

{
  if (1 < this->loglevel) {
    return;
  }
  std::mutex::lock(&this->mtx);
  if (this->colored == true) {
    std::operator<<(this->out,(string *)&this->infoColor);
  }
  std::operator<<(this->out,"[i] ");
  if (this->colored == true) {
    std::operator<<(this->out,"\x1b[0m");
  }
  print<char[10],int>(this,args,args_1);
  pthread_mutex_unlock((pthread_mutex_t *)&this->mtx);
  return;
}

Assistant:

void ConsoleLogger::info(const Args&... args)
{
	if (loglevel > 1) return;
	mtx.lock();
	if (colored) out << infoColor;
	out << "[i] ";
	if (colored) out << "\033[0m";
	print(args...);
	mtx.unlock();
}